

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O0

void mbedtls_psa_get_stats(mbedtls_psa_stats_t *stats)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  psa_app_key_id_t id_1;
  psa_app_key_id_t id;
  psa_key_slot_t *slot;
  psa_key_handle_t key;
  mbedtls_psa_stats_t *stats_local;
  
  memset(stats,0,0x38);
  for (slot._6_2_ = 1; slot._6_2_ < 0x21; slot._6_2_ = slot._6_2_ + 1) {
    iVar2 = slot._6_2_ - 1;
    iVar3 = psa_is_key_slot_occupied(global_data.key_slots + iVar2);
    if (iVar3 == 0) {
      stats->empty_slots = stats->empty_slots + 1;
    }
    else if (global_data.key_slots[iVar2].attr.lifetime == 0) {
      stats->volatile_slots = stats->volatile_slots + 1;
    }
    else if (global_data.key_slots[iVar2].attr.lifetime == 1) {
      uVar1 = global_data.key_slots[iVar2].attr.id;
      stats->persistent_slots = stats->persistent_slots + 1;
      if (stats->max_open_internal_key_id < uVar1) {
        stats->max_open_internal_key_id = uVar1;
      }
    }
    else {
      uVar1 = global_data.key_slots[iVar2].attr.id;
      stats->external_slots = stats->external_slots + 1;
      if (stats->max_open_external_key_id < uVar1) {
        stats->max_open_external_key_id = uVar1;
      }
    }
  }
  return;
}

Assistant:

void mbedtls_psa_get_stats( mbedtls_psa_stats_t *stats )
{
    psa_key_handle_t key;
    memset( stats, 0, sizeof( *stats ) );
    for( key = 1; key <= PSA_KEY_SLOT_COUNT; key++ )
    {
        const psa_key_slot_t *slot = &global_data.key_slots[key - 1];
        if( ! psa_is_key_slot_occupied( slot ) )
        {
            ++stats->empty_slots;
            continue;
        }
        if( slot->attr.lifetime == PSA_KEY_LIFETIME_VOLATILE )
            ++stats->volatile_slots;
        else if( slot->attr.lifetime == PSA_KEY_LIFETIME_PERSISTENT )
        {
            psa_app_key_id_t id = PSA_KEY_FILE_GET_KEY_ID(slot->attr.id);
            ++stats->persistent_slots;
            if( id > stats->max_open_internal_key_id )
                stats->max_open_internal_key_id = id;
        }
        else
        {
            psa_app_key_id_t id = PSA_KEY_FILE_GET_KEY_ID(slot->attr.id);
            ++stats->external_slots;
            if( id > stats->max_open_external_key_id )
                stats->max_open_external_key_id = id;
        }
    }
}